

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O2

TVariableIndex __thiscall
Refal2::CVariablesBuilder::AddLeft(CVariablesBuilder *this,TVariableName name,TVariableTypeTag type)

{
  int *piVar1;
  int iVar2;
  TVariableType type_00;
  bool bVar3;
  TVariableType TVar4;
  long lVar5;
  int iVar6;
  CQualifier *this_00;
  CQualifier *defaultQualifier;
  
  defaultQualifier = (CQualifier *)0x0;
  TVar4 = checkTypeTag(this,type,&defaultQualifier);
  iVar6 = -1;
  if (TVar4 != VT_None) {
    bVar3 = checkName(this,name);
    if (bVar3) {
      iVar2 = *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)name * 4);
      lVar5 = (long)iVar2;
      if (lVar5 == -1) {
        iVar6 = this->firstFreeVariableIndex;
        *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)name * 4) = iVar6;
        this->firstFreeVariableIndex = iVar6 + 1;
        this_00 = &this->variables[iVar6].Qualifier;
        this->variables[iVar6].Type = TVar4;
        this->variables[iVar6].CountLeft = 1;
        this->variables[iVar6].CountRight = 0;
        bVar3 = CQualifier::IsEmpty(this_00);
        if (!bVar3) {
          __assert_fail("variable.Qualifier.IsEmpty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                        ,0x83,
                        "TVariableIndex Refal2::CVariablesBuilder::AddLeft(const TVariableName, const TVariableTypeTag)"
                       );
        }
        if (defaultQualifier != (CQualifier *)0x0) {
          CQualifier::operator=(this_00,defaultQualifier);
        }
      }
      else {
        type_00 = this->variables[lVar5].Type;
        if (type_00 == TVar4) {
          piVar1 = &this->variables[lVar5].CountRight;
          *piVar1 = *piVar1 + 1;
          iVar6 = iVar2;
        }
        else {
          errorTypesNotMatched(this,name,type_00);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

TVariableIndex CVariablesBuilder::AddLeft( const TVariableName name,
	const TVariableTypeTag type )
{
	const CQualifier* defaultQualifier = nullptr;
	const TVariableType variableType = checkTypeTag( type, &defaultQualifier );
	if( variableType != VT_None && checkName( name ) ) {
		if( variableNameToIndex[name] == InvalidVariableIndex ) {
			variableNameToIndex[name] = firstFreeVariableIndex;
			firstFreeVariableIndex++;
			const TVariableIndex variableIndex = variableNameToIndex[name];
			CVariableData& variable = variables[variableIndex];
			variable.Type = variableType;
			variable.CountLeft = 1;
			variable.CountRight = 0;
			assert( variable.Qualifier.IsEmpty() );
			if( defaultQualifier != nullptr ) {
				variable.Qualifier = *defaultQualifier;
			}
			return variableIndex;
		} else {
			const TVariableIndex variableIndex = variableNameToIndex[name];
			CVariableData& variable = variables[variableIndex];
			if( variable.Type == variableType ) {
				variable.CountRight++;
				return variableIndex;
			} else {
				errorTypesNotMatched( name, variable.Type );
			}
		}
	}
	return InvalidVariableIndex;
}